

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O2

void * tabplay_tilde_new(t_symbol *s)

{
  t_object *owner;
  _clock *p_Var1;
  t_pd p_Var2;
  
  owner = (t_object *)pd_new(tabplay_tilde_class);
  p_Var1 = clock_new(owner,tabplay_tilde_tick);
  *(_clock **)&owner[1].te_xpix = p_Var1;
  *(undefined4 *)&owner[1].te_g.g_next = 0x7fffffff;
  *(undefined4 *)&owner[1].te_binbuf = 0;
  owner[1].te_inlet = (_inlet *)s;
  outlet_new(owner,&s_signal);
  p_Var2 = (t_pd)outlet_new(owner,&s_bang);
  owner[1].te_g.g_pd = p_Var2;
  return owner;
}

Assistant:

static void *tabplay_tilde_new(t_symbol *s)
{
    t_tabplay_tilde *x = (t_tabplay_tilde *)pd_new(tabplay_tilde_class);
    x->x_clock = clock_new(x, (t_method)tabplay_tilde_tick);
    x->x_phase = 0x7fffffff;
    x->x_limit = 0;
    x->x_arrayname = s;
    outlet_new(&x->x_obj, &s_signal);
    x->x_bangout = outlet_new(&x->x_obj, &s_bang);
    return (x);
}